

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_writer.cc
# Opt level: O2

Field * __thiscall
google::protobuf::util::converter::ProtoWriter::Lookup
          (ProtoWriter *this,StringPiece unnormalized_name)

{
  Field *pFVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *str;
  StringPiece *this_00;
  StringPiece unknown_name;
  StringPiece unknown_name_00;
  StringPiece local_70;
  StringPiece local_60;
  StringPiece local_50;
  StringPiece local_40;
  long lVar3;
  
  unknown_name.ptr_ = unnormalized_name.ptr_;
  iVar2 = (*(this->super_StructuredObjectWriter).super_ObjectWriter._vptr_ObjectWriter[0x11])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  if (lVar3 == 0) {
    str = "Root element must be a message.";
    this_00 = &local_70;
  }
  else {
    if (unnormalized_name.length_ == 0) {
      pFVar1 = *(Field **)(lVar3 + 0x28);
      if (pFVar1 == (Field *)0x0) {
        StringPiece::StringPiece(&local_60,"Proto fields must have a name.");
        unknown_name_00.length_ = 0;
        unknown_name_00.ptr_ = unknown_name.ptr_;
        InvalidName(this,unknown_name_00,local_60);
        return *(Field **)(lVar3 + 0x28);
      }
      if (pFVar1->cardinality_ != 3) {
        StringPiece::StringPiece(&local_50,"Proto fields must have a name.");
        unknown_name.length_ = 0;
        InvalidName(this,unknown_name,local_50);
        return (Field *)0x0;
      }
      return pFVar1;
    }
    iVar2 = (*this->typeinfo_->_vptr_TypeInfo[5])
                      (this->typeinfo_,*(undefined8 *)(lVar3 + 0x40),unknown_name.ptr_,
                       unnormalized_name.length_);
    if ((Field *)CONCAT44(extraout_var_00,iVar2) != (Field *)0x0) {
      return (Field *)CONCAT44(extraout_var_00,iVar2);
    }
    if (this->ignore_unknown_fields_ != false) {
      return (Field *)0x0;
    }
    str = "Cannot find field.";
    this_00 = &local_40;
  }
  StringPiece::StringPiece(this_00,str);
  InvalidName(this,unnormalized_name,*this_00);
  return (Field *)0x0;
}

Assistant:

const google::protobuf::Field* ProtoWriter::Lookup(
    StringPiece unnormalized_name) {
  ProtoElement* e = element();
  if (e == nullptr) {
    InvalidName(unnormalized_name, "Root element must be a message.");
    return nullptr;
  }
  if (unnormalized_name.empty()) {
    // Objects in repeated field inherit the same field descriptor.
    if (e->parent_field() == nullptr) {
      InvalidName(unnormalized_name, "Proto fields must have a name.");
    } else if (!IsRepeated(*e->parent_field())) {
      InvalidName(unnormalized_name, "Proto fields must have a name.");
      return nullptr;
    }
    return e->parent_field();
  }
  const google::protobuf::Field* field =
      typeinfo_->FindField(&e->type(), unnormalized_name);
  if (field == nullptr && !ignore_unknown_fields_) {
    InvalidName(unnormalized_name, "Cannot find field.");
  }
  return field;
}